

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::reset_update_rate
          (raw_quasi_adaptive_huffman_data_model *this)

{
  uint uVar1;
  unsigned_short *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar3 = this->m_total_syms;
  uVar1 = this->m_update_cycle;
  uVar4 = (uVar1 - this->m_symbols_until_update) + this->m_total_count;
  this->m_total_count = uVar4;
  if (uVar3 < uVar4) {
    if ((ulong)uVar3 == 0) {
      uVar5 = 0;
    }
    else {
      puVar2 = (this->m_sym_freq).m_p;
      uVar6 = 0;
      uVar5 = 0;
      do {
        uVar4 = puVar2[uVar6] + 1 >> 1;
        uVar5 = uVar5 + uVar4;
        puVar2[uVar6] = (unsigned_short)uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    this->m_total_count = uVar5;
  }
  uVar3 = 8;
  if (uVar1 < 8) {
    uVar3 = uVar1;
  }
  this->m_update_cycle = uVar3;
  this->m_symbols_until_update = uVar3;
  return;
}

Assistant:

void raw_quasi_adaptive_huffman_data_model::reset_update_rate()
   {
      m_total_count += (m_update_cycle - m_symbols_until_update);

#ifdef _DEBUG
      uint actual_total = 0;
      for (uint i = 0; i < m_sym_freq.size(); i++)
         actual_total += m_sym_freq[i];
      LZHAM_ASSERT(actual_total == m_total_count);
#endif

      if (m_total_count > m_total_syms)
         rescale();

      m_symbols_until_update = m_update_cycle = LZHAM_MIN(8, m_update_cycle);
   }